

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::FunctionBody::RecordStatementAdjustment
          (FunctionBody *this,uint offset,StatementAdjustmentType adjType)

{
  Type *pTVar1;
  int iVar2;
  AuxStatementData *pAVar3;
  Recycler *this_00;
  StatementAdjustmentRecord *pSVar4;
  Recycler *alloc;
  List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar5;
  uint local_58;
  StatementAdjustmentType SStack_54;
  StatementAdjustmentRecord record;
  
  EnsureAuxStatementData(this);
  pAVar3 = (this->m_sourceInfo).m_auxStatementData.ptr;
  this_00 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  if ((pAVar3 == (AuxStatementData *)0x0) ||
     ((pAVar3->m_statementAdjustmentRecords).ptr ==
      (List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0)) {
    _local_58 = &JsUtil::
                 List<Js::FunctionBody::StatementAdjustmentRecord,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>
                 ::typeinfo;
    record.m_byteCodeOffset = 0;
    record.m_adjustmentType = SAT_None;
    record._6_2_ = 0;
    alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)&stack0xffffffffffffffa8);
    pLVar5 = (List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
              *)new<Memory::Recycler>(0x30,alloc,0x387914);
    (pLVar5->
    super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
    ).alloc = this_00;
    (pLVar5->
    super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
    )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014db088;
    (pLVar5->
    super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
    ).buffer.ptr = (StatementAdjustmentRecord *)0x0;
    (pLVar5->
    super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
    ).count = 0;
    pLVar5->length = 0;
    pLVar5->increment = 4;
    pAVar3 = (this->m_sourceInfo).m_auxStatementData.ptr;
    Memory::Recycler::WBSetBit((char *)pAVar3);
    (pAVar3->m_statementAdjustmentRecords).ptr = pLVar5;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pAVar3);
  }
  StatementAdjustmentRecord::StatementAdjustmentRecord
            ((StatementAdjustmentRecord *)&stack0xffffffffffffffa8,adjType,offset);
  pAVar3 = (this->m_sourceInfo).m_auxStatementData.ptr;
  if (pAVar3 == (AuxStatementData *)0x0) {
    pLVar5 = (List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
              *)0x0;
  }
  else {
    pLVar5 = (pAVar3->m_statementAdjustmentRecords).ptr;
  }
  JsUtil::
  List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(pLVar5,0);
  pSVar4 = (pLVar5->
           super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
           ).buffer.ptr;
  iVar2 = (pLVar5->
          super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
          ).count;
  pSVar4[iVar2].m_adjustmentType = SStack_54;
  pSVar4[iVar2].m_byteCodeOffset = local_58;
  pTVar1 = &(pLVar5->
            super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
            ).count;
  *pTVar1 = *pTVar1 + 1;
  return;
}

Assistant:

void
    FunctionBody::RecordStatementAdjustment(uint offset, StatementAdjustmentType adjType)
    {
        this->EnsureAuxStatementData();

        Recycler* recycler = this->m_scriptContext->GetRecycler();
        if (this->GetStatementAdjustmentRecords() == nullptr)
        {
            m_sourceInfo.m_auxStatementData->m_statementAdjustmentRecords = RecyclerNew(recycler, StatementAdjustmentRecordList, recycler);
        }

        StatementAdjustmentRecord record(adjType, offset);
        this->GetStatementAdjustmentRecords()->Add(record); // Will copy stack value and put the copy into the container.
    }